

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

bool __thiscall
QAbstractProxyModel::dropMimeData
          (QAbstractProxyModel *this,QMimeData *data,DropAction action,int row,int column,
          QModelIndex *parent)

{
  int iVar1;
  QAbstractProxyModelPrivate *sourceRow;
  arrow_operator_result ppQVar2;
  undefined4 in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  int in_R8D;
  QModelIndex *in_R9;
  long in_FS_OFFSET;
  QAbstractProxyModelPrivate *d;
  QModelIndex sourceParent;
  int sourceDestinationColumn;
  int sourceDestinationRow;
  undefined1 **ppuVar3;
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  int in_stack_ffffffffffffffb8;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  uint local_10;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sourceRow = d_func((QAbstractProxyModel *)0x85411c);
  local_c = 0xaaaaaaaa;
  local_10 = 0xaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x85415b);
  ppuVar3 = &local_28;
  QAbstractProxyModelPrivate::mapDropCoordinatesToSource
            ((QAbstractProxyModelPrivate *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffb8,
             in_R9,(int *)sourceRow,
             (int *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             (QModelIndex *)sourceParent._0_8_);
  ppQVar2 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
            ::operator->(in_stack_ffffffffffffff90);
  iVar1 = (*((*ppQVar2)->super_QObject)._vptr_QObject[0x1c])
                    (*ppQVar2,in_RSI,(ulong)in_EDX,(ulong)local_c,(ulong)local_10,&local_28,ppuVar3)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)((byte)iVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractProxyModel::dropMimeData(const QMimeData *data, Qt::DropAction action,
                                       int row, int column, const QModelIndex &parent)
{
    Q_D(QAbstractProxyModel);
    int sourceDestinationRow;
    int sourceDestinationColumn;
    QModelIndex sourceParent;
    d->mapDropCoordinatesToSource(row, column, parent, &sourceDestinationRow, &sourceDestinationColumn, &sourceParent);
    return d->model->dropMimeData(data, action, sourceDestinationRow, sourceDestinationColumn, sourceParent);
}